

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlLoadCatalogs(void)

{
  char *val;
  undefined4 local_1c;
  int n_pathss;
  char *pathss;
  int test_ret;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    val = gen_const_char_ptr(local_1c,0);
    xmlLoadCatalogs(val);
    call_tests = call_tests + 1;
    des_const_char_ptr(local_1c,val,0);
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlLoadCatalogs(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    const char * pathss; /* a list of directories separated by a colon or a space. */
    int n_pathss;

    for (n_pathss = 0;n_pathss < gen_nb_const_char_ptr;n_pathss++) {
        pathss = gen_const_char_ptr(n_pathss, 0);

        xmlLoadCatalogs(pathss);
        call_tests++;
        des_const_char_ptr(n_pathss, pathss, 0);
        xmlResetLastError();
    }
    function_tests++;
#endif

    return(test_ret);
}